

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O2

void __thiscall sf::priv::JoystickManager::~JoystickManager(JoystickManager *this)

{
  int in_ESI;
  JoystickImpl *this_00;
  long lVar1;
  
  this_00 = (JoystickImpl *)this;
  for (lVar1 = 0; lVar1 != 0x940; lVar1 = lVar1 + 0x128) {
    if (*(char *)((long)this->m_joysticks[0].state.axes + lVar1 + -4) == '\x01') {
      this_00 = (JoystickImpl *)(this->m_joysticks[0].joystick.m_mapping + lVar1 + -4);
      JoystickImpl::close(this_00,in_ESI);
    }
  }
  JoystickImpl::cleanup((EVP_PKEY_CTX *)this_00);
  lVar1 = 0x818;
  do {
    Item::~Item((Item *)(this->m_joysticks[0].joystick.m_mapping + lVar1 + -4));
    lVar1 = lVar1 + -0x128;
  } while (lVar1 != -0x128);
  return;
}

Assistant:

JoystickManager::~JoystickManager()
{
    for (int i = 0; i < Joystick::Count; ++i)
    {
        if (m_joysticks[i].state.connected)
            m_joysticks[i].joystick.close();
    }

    JoystickImpl::cleanup();
}